

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_request.c
# Opt level: O0

int tnt_request_set_funcz(tnt_request *req,char *func)

{
  char *pcVar1;
  _Bool _Var2;
  size_t sVar3;
  char *func_local;
  tnt_request *req_local;
  
  _Var2 = is_call((req->hdr).type);
  if (_Var2) {
    if (func == (char *)0x0) {
      req_local._4_4_ = -1;
    }
    else {
      req->key = func;
      pcVar1 = req->key;
      sVar3 = strlen(req->key);
      req->key_end = pcVar1 + sVar3;
      req_local._4_4_ = 0;
    }
  }
  else {
    req_local._4_4_ = -1;
  }
  return req_local._4_4_;
}

Assistant:

int
tnt_request_set_funcz(struct tnt_request *req, const char *func)
{
	if (!is_call(req->hdr.type))
		return -1;
	if (!func)
		return -1;
	req->key = func; req->key_end = req->key + strlen(req->key);
	return 0;
}